

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ec_sign.c
# Opt level: O0

int fill_GOST_EC_params(EC_KEY *eckey,int nid)

{
  int iVar1;
  int in_ESI;
  EC_KEY *in_RDI;
  int ok;
  BN_CTX *ctx;
  BIGNUM *cofactor;
  BIGNUM *y;
  BIGNUM *x;
  BIGNUM *b;
  BIGNUM *a;
  BIGNUM *q;
  BIGNUM *p;
  EC_POINT *P;
  EC_GROUP *grp;
  R3410_ec_params *params;
  uint in_stack_ffffffffffffff88;
  int iVar2;
  BN_CTX *ctx_00;
  BIGNUM *local_68;
  BIGNUM *local_60;
  BIGNUM *local_58;
  BIGNUM *local_50;
  BIGNUM *local_48;
  BIGNUM *local_40;
  BIGNUM *local_38;
  EC_POINT *local_30;
  EC_GROUP *local_28;
  R3410_ec_params *local_20;
  int local_14;
  EC_KEY *local_10;
  
  local_14 = in_ESI;
  local_10 = in_RDI;
  local_20 = gost_nid2params(in_ESI);
  local_28 = (EC_GROUP *)0x0;
  local_30 = (EC_POINT *)0x0;
  local_38 = (BIGNUM *)0x0;
  local_40 = (BIGNUM *)0x0;
  local_48 = (BIGNUM *)0x0;
  local_50 = (BIGNUM *)0x0;
  local_58 = (BIGNUM *)0x0;
  local_60 = (BIGNUM *)0x0;
  local_68 = (BIGNUM *)0x0;
  ctx_00 = (BN_CTX *)0x0;
  iVar2 = 0;
  if ((local_10 != (EC_KEY *)0x0) && (local_20 != (R3410_ec_params *)0x0)) {
    if (local_20->group == (EC_GROUP *)0x0) {
      ctx_00 = BN_CTX_new();
      if (ctx_00 == (BN_CTX *)0x0) {
        ERR_GOST_error(0,0,(char *)CONCAT44(iVar2,in_stack_ffffffffffffff88),0);
        return 0;
      }
      BN_CTX_start(ctx_00);
      local_38 = BN_CTX_get(ctx_00);
      local_48 = BN_CTX_get(ctx_00);
      local_50 = BN_CTX_get(ctx_00);
      local_58 = BN_CTX_get(ctx_00);
      local_60 = BN_CTX_get(ctx_00);
      local_40 = BN_CTX_get(ctx_00);
      local_68 = BN_CTX_get(ctx_00);
      if ((((local_38 == (BIGNUM *)0x0) || (local_48 == (BIGNUM *)0x0)) ||
          (local_50 == (BIGNUM *)0x0)) ||
         (((local_58 == (BIGNUM *)0x0 || (local_60 == (BIGNUM *)0x0)) ||
          ((local_40 == (BIGNUM *)0x0 || (local_68 == (BIGNUM *)0x0)))))) {
        ERR_GOST_error((int)((ulong)ctx_00 >> 0x20),(int)ctx_00,
                       (char *)CONCAT44(iVar2,in_stack_ffffffffffffff88),0);
      }
      else {
        iVar1 = BN_hex2bn(&local_38,local_20->p);
        if (((iVar1 == 0) || (iVar1 = BN_hex2bn(&local_48,local_20->a), iVar1 == 0)) ||
           ((iVar1 = BN_hex2bn(&local_50,local_20->b), iVar1 == 0 ||
            (iVar1 = BN_hex2bn(&local_68,local_20->cofactor), iVar1 == 0)))) {
          ERR_GOST_error((int)((ulong)ctx_00 >> 0x20),(int)ctx_00,
                         (char *)CONCAT44(iVar2,in_stack_ffffffffffffff88),0);
        }
        else {
          local_28 = EC_GROUP_new_curve_GFp(local_38,local_48,local_50,ctx_00);
          if (local_28 == (EC_GROUP *)0x0) {
            ERR_GOST_error((int)((ulong)ctx_00 >> 0x20),(int)ctx_00,
                           (char *)CONCAT44(iVar2,in_stack_ffffffffffffff88),0);
          }
          else {
            local_30 = EC_POINT_new(local_28);
            if (local_30 == (EC_POINT *)0x0) {
              ERR_GOST_error((int)((ulong)ctx_00 >> 0x20),(int)ctx_00,
                             (char *)CONCAT44(iVar2,in_stack_ffffffffffffff88),0);
            }
            else {
              iVar1 = BN_hex2bn(&local_58,local_20->x);
              if ((((iVar1 == 0) || (iVar1 = BN_hex2bn(&local_60,local_20->y), iVar1 == 0)) ||
                  (iVar1 = EC_POINT_set_affine_coordinates
                                     (local_28,local_30,local_58,local_60,ctx_00), iVar1 == 0)) ||
                 (iVar1 = BN_hex2bn(&local_40,local_20->q), iVar1 == 0)) {
                ERR_GOST_error((int)((ulong)ctx_00 >> 0x20),(int)ctx_00,
                               (char *)CONCAT44(iVar2,in_stack_ffffffffffffff88),0);
              }
              else {
                iVar1 = EC_GROUP_set_generator(local_28,local_30,local_40,local_68);
                if (iVar1 == 0) {
                  ERR_GOST_error((int)((ulong)ctx_00 >> 0x20),(int)ctx_00,
                                 (char *)CONCAT44(iVar2,in_stack_ffffffffffffff88),0);
                }
                else {
                  EC_GROUP_set_curve_name(local_28,local_14);
                  local_20->group = (EC_GROUP *)local_28;
                  iVar1 = EC_KEY_set_group(local_10,local_28);
                  if (iVar1 == 0) {
                    ERR_GOST_error((int)((ulong)ctx_00 >> 0x20),(int)ctx_00,
                                   (char *)CONCAT44(iVar2,in_stack_ffffffffffffff88),0);
                  }
                  else {
                    iVar2 = 1;
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      EC_GROUP_set_curve_name((EC_GROUP *)local_20->group,local_14);
      iVar1 = EC_KEY_set_group(local_10,(EC_GROUP *)local_20->group);
      if (iVar1 != 0) {
        return 1;
      }
      ERR_GOST_error((int)((ulong)ctx_00 >> 0x20),(int)ctx_00,
                     (char *)CONCAT44(iVar2,in_stack_ffffffffffffff88),0);
    }
    EC_POINT_free(local_30);
    BN_CTX_end(ctx_00);
    BN_CTX_free(ctx_00);
    return iVar2;
  }
  ERR_GOST_error(0,0,(char *)(ulong)in_stack_ffffffffffffff88,0);
  return 0;
}

Assistant:

int fill_GOST_EC_params(EC_KEY *eckey, int nid)
{
    R3410_ec_params *params = gost_nid2params(nid);
    EC_GROUP *grp = NULL;
    EC_POINT *P = NULL;
    BIGNUM *p = NULL, *q = NULL, *a = NULL, *b = NULL, *x = NULL, *y =
        NULL, *cofactor = NULL;
    BN_CTX *ctx = NULL;
    int ok = 0;

    if (!eckey || !params) {
        GOSTerr(GOST_F_FILL_GOST_EC_PARAMS, GOST_R_UNSUPPORTED_PARAMETER_SET);
        return 0;
    }

    if (params->group) {
        EC_GROUP_set_curve_name(params->group, nid);
        if (!EC_KEY_set_group(eckey, params->group)) {
            GOSTerr(GOST_F_FILL_GOST_EC_PARAMS, ERR_R_INTERNAL_ERROR);
            goto end;
        }
        return 1;
    }

    if (!(ctx = BN_CTX_new())) {
        GOSTerr(GOST_F_FILL_GOST_EC_PARAMS, ERR_R_MALLOC_FAILURE);
        return 0;
    }

    BN_CTX_start(ctx);
    p = BN_CTX_get(ctx);
    a = BN_CTX_get(ctx);
    b = BN_CTX_get(ctx);
    x = BN_CTX_get(ctx);
    y = BN_CTX_get(ctx);
    q = BN_CTX_get(ctx);
    cofactor = BN_CTX_get(ctx);
    if (!p || !a || !b || !x || !y || !q || !cofactor) {
        GOSTerr(GOST_F_FILL_GOST_EC_PARAMS, ERR_R_MALLOC_FAILURE);
        goto end;
    }

    if (!BN_hex2bn(&p, params->p)
        || !BN_hex2bn(&a, params->a)
        || !BN_hex2bn(&b, params->b)
        || !BN_hex2bn(&cofactor, params->cofactor)) {
        GOSTerr(GOST_F_FILL_GOST_EC_PARAMS, ERR_R_INTERNAL_ERROR);
        goto end;
    }

    grp = EC_GROUP_new_curve_GFp(p, a, b, ctx);
    if (!grp) {
        GOSTerr(GOST_F_FILL_GOST_EC_PARAMS, ERR_R_MALLOC_FAILURE);
        goto end;
    }

    P = EC_POINT_new(grp);
    if (!P) {
        GOSTerr(GOST_F_FILL_GOST_EC_PARAMS, ERR_R_MALLOC_FAILURE);
        goto end;
    }

    if (!BN_hex2bn(&x, params->x)
        || !BN_hex2bn(&y, params->y)
        || !EC_POINT_set_affine_coordinates(grp, P, x, y, ctx)
        || !BN_hex2bn(&q, params->q)) {
        GOSTerr(GOST_F_FILL_GOST_EC_PARAMS, ERR_R_INTERNAL_ERROR);
        goto end;
    }

    if (!EC_GROUP_set_generator(grp, P, q, cofactor)) {
        GOSTerr(GOST_F_FILL_GOST_EC_PARAMS, ERR_R_INTERNAL_ERROR);
        goto end;
    }
    EC_GROUP_set_curve_name(grp, nid);
    params->group = grp;
    if (!EC_KEY_set_group(eckey, grp)) {
        GOSTerr(GOST_F_FILL_GOST_EC_PARAMS, ERR_R_INTERNAL_ERROR);
        goto end;
    }
    ok = 1;
 end:
    EC_POINT_free(P);
    BN_CTX_end(ctx);
    BN_CTX_free(ctx);
    return ok;
}